

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O2

bool __thiscall
cppnet::TimerContainer::AddTimer
          (TimerContainer *this,weak_ptr<cppnet::TimerSlot> *t,uint32_t time,bool always)

{
  element_type *peVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  shared_ptr<cppnet::TimerSlot> ptr;
  __shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2> local_48;
  __weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  if (this->_timer_max <= time) {
    return false;
  }
  std::__shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_58);
  if (local_58._M_ptr != (TimerSlot *)0x0) {
    if ((time < this->_time_unit) &&
       (peVar1 = (this->_sub_timer).
                 super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
       peVar1 != (element_type *)0x0)) {
      std::__weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                (&local_38,&t->super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>);
      iVar4 = (**(peVar1->super_Timer)._vptr_Timer)(peVar1,&local_38,(ulong)time,always);
      uVar3 = (undefined1)iVar4;
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_38._M_refcount);
      goto LAB_0011c436;
    }
    bVar2 = TimerSlot::IsInTimer(local_58._M_ptr);
    if (!bVar2) {
      TimerSlot::SetInterval(local_58._M_ptr,time);
      TimerSlot::SetInTimer(local_58._M_ptr);
      if (always) {
        TimerSlot::SetAlways(local_58._M_ptr);
      }
      std::__shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_48,&local_58);
      uVar3 = InnerAddTimer(this,(shared_ptr<cppnet::TimerSlot> *)&local_48,time);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
      goto LAB_0011c436;
    }
  }
  uVar3 = 0;
LAB_0011c436:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  return (bool)uVar3;
}

Assistant:

bool TimerContainer::AddTimer(std::weak_ptr<TimerSlot> t, uint32_t time, bool always) {
    if (time >= _timer_max) {
        return false;
    }

    auto ptr = t.lock();
    if (!ptr) {
        return false;
    }

    if (time < _time_unit && _sub_timer) {
        return _sub_timer->AddTimer(t, time, always);
    }

    // set current timer unit interval
    if (!ptr->IsInTimer()) {
        ptr->SetInterval(time);
        ptr->SetInTimer();
        if (always) {
            ptr->SetAlways();
        }

    } else {
        return false;
    }

    return InnerAddTimer(ptr, time);
}